

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re3q3.cc
# Opt level: O0

void re3q3::rotation_to_3q3
               (Matrix<double,_3,_10,_0,_3,_10> *Rcoeffs,Matrix<double,_3,_10,_0,_3,_10> *coeffs)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  CoeffReturnType pdVar5;
  Scalar *pSVar6;
  int k;
  double in_stack_ffffffffffffff08;
  DenseCoeffsBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>,_0> *in_stack_ffffffffffffff10;
  undefined4 local_14;
  
  for (local_14 = 0; local_14 < 3; local_14 = local_14 + 1) {
    pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>,_0>::operator()
                       (in_stack_ffffffffffffff10,(Index)in_stack_ffffffffffffff08,0x2041f9);
    in_stack_ffffffffffffff08 = *pdVar5;
    pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>,_0>::operator()
                       (in_stack_ffffffffffffff10,(Index)in_stack_ffffffffffffff08,0x20421c);
    in_stack_ffffffffffffff10 =
         (DenseCoeffsBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>,_0> *)
         (in_stack_ffffffffffffff08 - *pdVar5);
    pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>,_0>::operator()
                       (in_stack_ffffffffffffff10,(Index)in_stack_ffffffffffffff08,0x204245);
    dVar4 = (double)in_stack_ffffffffffffff10 - *pdVar5;
    pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>,_0>::operator()
                       (in_stack_ffffffffffffff10,(Index)in_stack_ffffffffffffff08,0x20426f);
    dVar1 = *pdVar5;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>,_1> *)
                        in_stack_ffffffffffffff10,(Index)in_stack_ffffffffffffff08,0x204298);
    *pSVar6 = dVar4 + dVar1;
    pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>,_0>::operator()
                       (in_stack_ffffffffffffff10,(Index)in_stack_ffffffffffffff08,0x2042bc);
    dVar1 = *pdVar5;
    pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>,_0>::operator()
                       (in_stack_ffffffffffffff10,(Index)in_stack_ffffffffffffff08,0x2042e8);
    dVar4 = *pdVar5;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>,_1> *)
                        in_stack_ffffffffffffff10,(Index)in_stack_ffffffffffffff08,0x20431e);
    *pSVar6 = dVar1 * 2.0 + dVar4 * 2.0;
    pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>,_0>::operator()
                       (in_stack_ffffffffffffff10,(Index)in_stack_ffffffffffffff08,0x204342);
    dVar1 = *pdVar5;
    pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>,_0>::operator()
                       (in_stack_ffffffffffffff10,(Index)in_stack_ffffffffffffff08,0x20436e);
    dVar4 = *pdVar5;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>,_1> *)
                        in_stack_ffffffffffffff10,(Index)in_stack_ffffffffffffff08,0x2043a4);
    *pSVar6 = dVar1 * 2.0 + dVar4 * 2.0;
    pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>,_0>::operator()
                       (in_stack_ffffffffffffff10,(Index)in_stack_ffffffffffffff08,0x2043c8);
    dVar1 = *pdVar5;
    pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>,_0>::operator()
                       (in_stack_ffffffffffffff10,(Index)in_stack_ffffffffffffff08,0x2043eb);
    dVar4 = *pdVar5;
    pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>,_0>::operator()
                       (in_stack_ffffffffffffff10,(Index)in_stack_ffffffffffffff08,0x204415);
    dVar2 = *pdVar5;
    pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>,_0>::operator()
                       (in_stack_ffffffffffffff10,(Index)in_stack_ffffffffffffff08,0x20443f);
    dVar3 = *pdVar5;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>,_1> *)
                        in_stack_ffffffffffffff10,(Index)in_stack_ffffffffffffff08,0x204469);
    *pSVar6 = ((dVar1 - dVar4) - dVar2) + dVar3;
    pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>,_0>::operator()
                       (in_stack_ffffffffffffff10,(Index)in_stack_ffffffffffffff08,0x20448d);
    dVar1 = *pdVar5;
    pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>,_0>::operator()
                       (in_stack_ffffffffffffff10,(Index)in_stack_ffffffffffffff08,0x2044b9);
    dVar4 = *pdVar5;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>,_1> *)
                        in_stack_ffffffffffffff10,(Index)in_stack_ffffffffffffff08,0x2044ef);
    *pSVar6 = dVar1 * 2.0 + dVar4 * 2.0;
    pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>,_0>::operator()
                       (in_stack_ffffffffffffff10,(Index)in_stack_ffffffffffffff08,0x204513);
    dVar1 = *pdVar5;
    pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>,_0>::operator()
                       (in_stack_ffffffffffffff10,(Index)in_stack_ffffffffffffff08,0x204537);
    dVar4 = *pdVar5;
    pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>,_0>::operator()
                       (in_stack_ffffffffffffff10,(Index)in_stack_ffffffffffffff08,0x204560);
    dVar2 = *pdVar5;
    pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>,_0>::operator()
                       (in_stack_ffffffffffffff10,(Index)in_stack_ffffffffffffff08,0x20458d);
    dVar3 = *pdVar5;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>,_1> *)
                        in_stack_ffffffffffffff10,(Index)in_stack_ffffffffffffff08,0x2045bd);
    *pSVar6 = ((dVar1 - dVar4) - dVar2) + dVar3;
    pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>,_0>::operator()
                       (in_stack_ffffffffffffff10,(Index)in_stack_ffffffffffffff08,0x2045e4);
    dVar1 = *pdVar5;
    pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>,_0>::operator()
                       (in_stack_ffffffffffffff10,(Index)in_stack_ffffffffffffff08,0x204613);
    dVar4 = *pdVar5;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>,_1> *)
                        in_stack_ffffffffffffff10,(Index)in_stack_ffffffffffffff08,0x20464f);
    *pSVar6 = dVar1 * 2.0 - dVar4 * 2.0;
    pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>,_0>::operator()
                       (in_stack_ffffffffffffff10,(Index)in_stack_ffffffffffffff08,0x204676);
    dVar1 = *pdVar5;
    pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>,_0>::operator()
                       (in_stack_ffffffffffffff10,(Index)in_stack_ffffffffffffff08,0x2046a5);
    dVar4 = *pdVar5;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>,_1> *)
                        in_stack_ffffffffffffff10,(Index)in_stack_ffffffffffffff08,0x2046e1);
    *pSVar6 = dVar1 * 2.0 - dVar4 * 2.0;
    pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>,_0>::operator()
                       (in_stack_ffffffffffffff10,(Index)in_stack_ffffffffffffff08,0x204708);
    dVar1 = *pdVar5;
    pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>,_0>::operator()
                       (in_stack_ffffffffffffff10,(Index)in_stack_ffffffffffffff08,0x204737);
    dVar4 = *pdVar5;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>,_1> *)
                        in_stack_ffffffffffffff10,(Index)in_stack_ffffffffffffff08,0x204773);
    *pSVar6 = dVar1 * 2.0 - dVar4 * 2.0;
    pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>,_0>::operator()
                       (in_stack_ffffffffffffff10,(Index)in_stack_ffffffffffffff08,0x204799);
    dVar1 = *pdVar5;
    pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>,_0>::operator()
                       (in_stack_ffffffffffffff10,(Index)in_stack_ffffffffffffff08,0x2047c0);
    dVar4 = *pdVar5;
    pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>,_0>::operator()
                       (in_stack_ffffffffffffff10,(Index)in_stack_ffffffffffffff08,0x2047f0);
    dVar2 = *pdVar5;
    pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>,_0>::operator()
                       (in_stack_ffffffffffffff10,(Index)in_stack_ffffffffffffff08,0x204820);
    dVar3 = *pdVar5;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>,_1> *)
                        in_stack_ffffffffffffff10,(Index)in_stack_ffffffffffffff08,0x204850);
    *pSVar6 = dVar1 + dVar4 + dVar2 + dVar3;
  }
  return;
}

Assistant:

void rotation_to_3q3(const Eigen::Matrix<double, 3, 10> &Rcoeffs, Eigen::Matrix<double, 3, 10> *coeffs) {
    for (int k = 0; k < 3; k++) {
        (*coeffs)(k, 0) = Rcoeffs(k, 0) - Rcoeffs(k, 4) - Rcoeffs(k, 8) + Rcoeffs(k, 9);
        (*coeffs)(k, 1) = 2 * Rcoeffs(k, 1) + 2 * Rcoeffs(k, 3);
        (*coeffs)(k, 2) = 2 * Rcoeffs(k, 2) + 2 * Rcoeffs(k, 6);
        (*coeffs)(k, 3) = Rcoeffs(k, 4) - Rcoeffs(k, 0) - Rcoeffs(k, 8) + Rcoeffs(k, 9);
        (*coeffs)(k, 4) = 2 * Rcoeffs(k, 5) + 2 * Rcoeffs(k, 7);
        (*coeffs)(k, 5) = Rcoeffs(k, 8) - Rcoeffs(k, 4) - Rcoeffs(k, 0) + Rcoeffs(k, 9);
        (*coeffs)(k, 6) = 2 * Rcoeffs(k, 5) - 2 * Rcoeffs(k, 7);
        (*coeffs)(k, 7) = 2 * Rcoeffs(k, 6) - 2 * Rcoeffs(k, 2);
        (*coeffs)(k, 8) = 2 * Rcoeffs(k, 1) - 2 * Rcoeffs(k, 3);
        (*coeffs)(k, 9) = Rcoeffs(k, 0) + Rcoeffs(k, 4) + Rcoeffs(k, 8) + Rcoeffs(k, 9);
    }
}